

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.hpp
# Opt level: O0

optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> __thiscall
duckdb::Catalog::GetEntry<duckdb::AggregateFunctionCatalogEntry>
          (Catalog *this,ClientContext *context,string *schema_name,string *name,
          OnEntryNotFound if_not_found,QueryErrorContext error_context)

{
  QueryErrorContext error_context_p;
  bool bVar1;
  CatalogEntry *pCVar2;
  undefined8 uVar3;
  AggregateFunctionCatalogEntry *ptr_p;
  string *in_RCX;
  CatalogException *in_RDX;
  optional_idx in_RSI;
  EntryLookupInfo *in_RDI;
  undefined1 in_R8B;
  optional_ptr<duckdb::CatalogEntry,_true> entry;
  EntryLookupInfo lookup_info;
  string *in_stack_ffffffffffffff18;
  CatalogEntry *in_stack_ffffffffffffff20;
  allocator *paVar4;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  string local_c8 [55];
  allocator local_91;
  string local_90 [15];
  OnEntryNotFound in_stack_ffffffffffffff7f;
  EntryLookupInfo *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  ClientContext *in_stack_ffffffffffffff90;
  Catalog *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc8;
  optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true> local_8;
  
  error_context_p.query_location.index._7_1_ = in_stack_ffffffffffffff37;
  error_context_p.query_location.index._0_7_ = in_stack_ffffffffffffff30;
  EntryLookupInfo::EntryLookupInfo
            (in_RDI,(CatalogType)((ulong)in_stack_ffffffffffffff20 >> 0x38),
             in_stack_ffffffffffffff18,error_context_p);
  GetEntry(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
           in_stack_ffffffffffffff80,in_stack_ffffffffffffff7f);
  bVar1 = duckdb::optional_ptr::operator_cast_to_bool((optional_ptr *)&stack0xffffffffffffff98);
  if (bVar1) {
    pCVar2 = optional_ptr<duckdb::CatalogEntry,_true>::operator->
                       ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff20);
    if (pCVar2->type != AGGREGATE_FUNCTION_ENTRY) {
      uVar3 = __cxa_allocate_exception(0x10);
      paVar4 = &local_91;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_90,"%s is not an %s",paVar4);
      ::std::__cxx11::string::string(local_c8,(string *)in_RCX);
      CatalogException::CatalogException<std::__cxx11::string,char_const*>
                (in_RDX,(QueryErrorContext)in_RSI.index,in_RCX,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_R8B,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc0);
      __cxa_throw(uVar3,&CatalogException::typeinfo,CatalogException::~CatalogException);
    }
    optional_ptr<duckdb::CatalogEntry,_true>::operator->
              ((optional_ptr<duckdb::CatalogEntry,_true> *)in_stack_ffffffffffffff20);
    ptr_p = CatalogEntry::Cast<duckdb::AggregateFunctionCatalogEntry>(in_stack_ffffffffffffff20);
    optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::optional_ptr(&local_8,ptr_p);
  }
  else {
    optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>::optional_ptr
              (&local_8,(AggregateFunctionCatalogEntry *)0x0);
  }
  return (optional_ptr<duckdb::AggregateFunctionCatalogEntry,_true>)local_8.ptr;
}

Assistant:

optional_ptr<T> GetEntry(ClientContext &context, const string &schema_name, const string &name,
	                         OnEntryNotFound if_not_found, QueryErrorContext error_context = QueryErrorContext()) {
		EntryLookupInfo lookup_info(T::Type, name, error_context);
		auto entry = GetEntry(context, schema_name, lookup_info, if_not_found);
		if (!entry) {
			return nullptr;
		}
		if (entry->type != T::Type) {
			throw CatalogException(error_context, "%s is not an %s", name, T::Name);
		}
		return &entry->template Cast<T>();
	}